

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O0

void __thiscall QSqlRecord::insert(QSqlRecord *this,int pos,QSqlField *field)

{
  QList<QSqlField> *in_RDX;
  parameter_type in_RDI;
  qsizetype in_stack_ffffffffffffffe0;
  
  detach((QSqlRecord *)0x13c1a4);
  QExplicitlySharedDataPointer<QSqlRecordPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSqlRecordPrivate> *)0x13c1ad);
  QList<QSqlField>::insert(in_RDX,in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

void QSqlRecord::insert(int pos, const QSqlField &field)
{
   detach();
   d->fields.insert(pos, field);
}